

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_expression_iterator.cpp
# Opt level: O1

void duckdb::ParsedExpressionIterator::EnumerateChildren
               (ParsedExpression *expr,
               function<void_(duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_&)>
               *callback)

{
  ExpressionClass EVar1;
  pointer pCVar2;
  _Manager_type p_Var3;
  pointer puVar4;
  pointer pOVar5;
  NotImplementedException *this;
  OperatorExpression *pOVar6;
  ConjunctionExpression *pCVar7;
  StarExpression *pSVar8;
  FunctionExpression *pFVar9;
  CaseExpression *pCVar10;
  SubqueryExpression *pSVar11;
  WindowExpression *pWVar12;
  LambdaExpression *pLVar13;
  CastExpression *pCVar14;
  pointer pOVar15;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child;
  pointer puVar16;
  _Hash_node_base *p_Var17;
  pointer pOVar18;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *puVar19
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *child_2
  ;
  pointer pCVar20;
  string local_48;
  
  EVar1 = (expr->super_BaseExpression).expression_class;
  switch(EVar1) {
  case CASE:
    pCVar10 = BaseExpression::Cast<duckdb::CaseExpression>(&expr->super_BaseExpression);
    pCVar2 = (pCVar10->case_checks).
             super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
             super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar20 = (pCVar10->case_checks).
                   super_vector<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>.
                   super__Vector_base<duckdb::CaseCheck,_std::allocator<duckdb::CaseCheck>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar20 != pCVar2; pCVar20 = pCVar20 + 1) {
      if (((callback->super__Function_base)._M_manager == (_Manager_type)0x0) ||
         ((*callback->_M_invoker)((_Any_data *)callback,&pCVar20->when_expr),
         (callback->super__Function_base)._M_manager == (_Manager_type)0x0)) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pCVar20->then_expr);
    }
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
    puVar19 = &pCVar10->else_expr;
    goto LAB_00ec75eb;
  case CAST:
    pCVar14 = BaseExpression::Cast<duckdb::CastExpression>(&expr->super_BaseExpression);
    goto LAB_00ec752c;
  case COLUMN_REF:
  case CONSTANT:
  case DEFAULT:
  case PARAMETER:
  case POSITIONAL_REFERENCE:
  case LAMBDA_REF:
    break;
  case COMPARISON:
    pLVar13 = (LambdaExpression *)
              BaseExpression::Cast<duckdb::ComparisonExpression>(&expr->super_BaseExpression);
    goto LAB_00ec74fb;
  case CONJUNCTION:
    pCVar7 = BaseExpression::Cast<duckdb::ConjunctionExpression>(&expr->super_BaseExpression);
    puVar4 = (pCVar7->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pCVar7->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
        puVar16 = puVar16 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,puVar16);
    }
    break;
  case FUNCTION:
    pFVar9 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
    puVar4 = (pFVar9->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pFVar9->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
        puVar16 = puVar16 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,puVar16);
    }
    if ((pFVar9->filter).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pFVar9->filter);
    }
    if ((pFVar9->order_bys).
        super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
        super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>
        .super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl != (OrderModifier *)0x0)
    {
      pOVar15 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->(&pFVar9->order_bys);
      pOVar5 = (pOVar15->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      for (pOVar18 = (pOVar15->orders).
                     super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                     _M_impl.super__Vector_impl_data._M_start; pOVar18 != pOVar5;
          pOVar18 = pOVar18 + 1) {
        if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
        (*callback->_M_invoker)((_Any_data *)callback,&pOVar18->expression);
      }
    }
    break;
  case OPERATOR:
    pOVar6 = BaseExpression::Cast<duckdb::OperatorExpression>(&expr->super_BaseExpression);
    puVar4 = (pOVar6->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pOVar6->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
        puVar16 = puVar16 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,puVar16);
    }
    break;
  case STAR:
    pSVar8 = BaseExpression::Cast<duckdb::StarExpression>(&expr->super_BaseExpression);
    if ((pSVar8->expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pSVar8->expr);
    }
    for (p_Var17 = (pSVar8->replace_list)._M_h._M_before_begin._M_nxt;
        p_Var17 != (_Hash_node_base *)0x0; p_Var17 = p_Var17->_M_nxt) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)
                ((_Any_data *)callback,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)(p_Var17 + 5));
    }
    break;
  case DEFAULT|COLUMN_REF:
switchD_00ec72a9_caseD_c:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Unimplemented expression class","");
    NotImplementedException::NotImplementedException(this,&local_48);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case SUBQUERY:
    pSVar11 = BaseExpression::Cast<duckdb::SubqueryExpression>(&expr->super_BaseExpression);
    if ((pSVar11->child).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
        (ParsedExpression *)0x0) {
      return;
    }
    p_Var3 = (callback->super__Function_base)._M_manager;
    goto joined_r0x00ec74ae;
  case WINDOW:
    pWVar12 = BaseExpression::Cast<duckdb::WindowExpression>(&expr->super_BaseExpression);
    puVar4 = (pWVar12->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pWVar12->partitions).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
        puVar16 = puVar16 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,puVar16);
    }
    pOVar5 = (pWVar12->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar18 = (pWVar12->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pOVar18 != pOVar5;
        pOVar18 = pOVar18 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pOVar18->expression);
    }
    puVar4 = (pWVar12->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar16 = (pWVar12->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar4;
        puVar16 = puVar16 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,puVar16);
    }
    if ((pWVar12->filter_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pWVar12->filter_expr);
    }
    if ((pWVar12->start_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pWVar12->start_expr);
    }
    if ((pWVar12->end_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pWVar12->end_expr);
    }
    if ((pWVar12->offset_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pWVar12->offset_expr);
    }
    if ((pWVar12->default_expr).
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pWVar12->default_expr);
    }
    pOVar5 = (pWVar12->arg_orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar18 = (pWVar12->arg_orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pOVar18 != pOVar5;
        pOVar18 = pOVar18 + 1) {
      if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00ec76ff;
      (*callback->_M_invoker)((_Any_data *)callback,&pOVar18->expression);
    }
    break;
  case COLLATE:
    pCVar14 = (CastExpression *)
              BaseExpression::Cast<duckdb::CollateExpression>(&expr->super_BaseExpression);
LAB_00ec752c:
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00ec76ff:
      ::std::__throw_bad_function_call();
    }
    puVar19 = &pCVar14->child;
LAB_00ec75eb:
    (*callback->_M_invoker)((_Any_data *)callback,puVar19);
    return;
  case LAMBDA:
    pLVar13 = BaseExpression::Cast<duckdb::LambdaExpression>(&expr->super_BaseExpression);
LAB_00ec74fb:
    if (((callback->super__Function_base)._M_manager == (_Manager_type)0x0) ||
       ((*callback->_M_invoker)((_Any_data *)callback,&pLVar13->lhs),
       (callback->super__Function_base)._M_manager == (_Manager_type)0x0)) goto LAB_00ec76ff;
    puVar19 = &pLVar13->expr;
    goto LAB_00ec75eb;
  case BETWEEN:
    pSVar11 = (SubqueryExpression *)
              BaseExpression::Cast<duckdb::BetweenExpression>(&expr->super_BaseExpression);
    if (((callback->super__Function_base)._M_manager == (_Manager_type)0x0) ||
       ((*callback->_M_invoker)
                  ((_Any_data *)callback,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&pSVar11->subquery),
       (callback->super__Function_base)._M_manager == (_Manager_type)0x0)) goto LAB_00ec76ff;
    (*callback->_M_invoker)
              ((_Any_data *)callback,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&pSVar11->subquery_type);
    p_Var3 = (callback->super__Function_base)._M_manager;
joined_r0x00ec74ae:
    if (p_Var3 == (_Manager_type)0x0) goto LAB_00ec76ff;
    puVar19 = &pSVar11->child;
    goto LAB_00ec75eb;
  default:
    if (EVar1 != BOUND_EXPRESSION) goto switchD_00ec72a9_caseD_c;
  }
  return;
}

Assistant:

void ParsedExpressionIterator::EnumerateChildren(
    ParsedExpression &expr, const std::function<void(unique_ptr<ParsedExpression> &child)> &callback) {
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::BETWEEN: {
		auto &cast_expr = expr.Cast<BetweenExpression>();
		callback(cast_expr.input);
		callback(cast_expr.lower);
		callback(cast_expr.upper);
		break;
	}
	case ExpressionClass::CASE: {
		auto &case_expr = expr.Cast<CaseExpression>();
		for (auto &check : case_expr.case_checks) {
			callback(check.when_expr);
			callback(check.then_expr);
		}
		callback(case_expr.else_expr);
		break;
	}
	case ExpressionClass::CAST: {
		auto &cast_expr = expr.Cast<CastExpression>();
		callback(cast_expr.child);
		break;
	}
	case ExpressionClass::COLLATE: {
		auto &cast_expr = expr.Cast<CollateExpression>();
		callback(cast_expr.child);
		break;
	}
	case ExpressionClass::COMPARISON: {
		auto &comp_expr = expr.Cast<ComparisonExpression>();
		callback(comp_expr.left);
		callback(comp_expr.right);
		break;
	}
	case ExpressionClass::CONJUNCTION: {
		auto &conj_expr = expr.Cast<ConjunctionExpression>();
		for (auto &child : conj_expr.children) {
			callback(child);
		}
		break;
	}

	case ExpressionClass::FUNCTION: {
		auto &func_expr = expr.Cast<FunctionExpression>();
		for (auto &child : func_expr.children) {
			callback(child);
		}
		if (func_expr.filter) {
			callback(func_expr.filter);
		}
		if (func_expr.order_bys) {
			for (auto &order : func_expr.order_bys->orders) {
				callback(order.expression);
			}
		}
		break;
	}
	case ExpressionClass::LAMBDA: {
		auto &lambda_expr = expr.Cast<LambdaExpression>();
		callback(lambda_expr.lhs);
		callback(lambda_expr.expr);
		break;
	}
	case ExpressionClass::OPERATOR: {
		auto &op_expr = expr.Cast<OperatorExpression>();
		for (auto &child : op_expr.children) {
			callback(child);
		}
		break;
	}
	case ExpressionClass::STAR: {
		auto &star_expr = expr.Cast<StarExpression>();
		if (star_expr.expr) {
			callback(star_expr.expr);
		}
		for (auto &item : star_expr.replace_list) {
			callback(item.second);
		}
		break;
	}
	case ExpressionClass::SUBQUERY: {
		auto &subquery_expr = expr.Cast<SubqueryExpression>();
		if (subquery_expr.child) {
			callback(subquery_expr.child);
		}
		break;
	}
	case ExpressionClass::WINDOW: {
		auto &window_expr = expr.Cast<WindowExpression>();
		for (auto &partition : window_expr.partitions) {
			callback(partition);
		}
		for (auto &order : window_expr.orders) {
			callback(order.expression);
		}
		for (auto &child : window_expr.children) {
			callback(child);
		}
		if (window_expr.filter_expr) {
			callback(window_expr.filter_expr);
		}
		if (window_expr.start_expr) {
			callback(window_expr.start_expr);
		}
		if (window_expr.end_expr) {
			callback(window_expr.end_expr);
		}
		if (window_expr.offset_expr) {
			callback(window_expr.offset_expr);
		}
		if (window_expr.default_expr) {
			callback(window_expr.default_expr);
		}
		for (auto &order : window_expr.arg_orders) {
			callback(order.expression);
		}
		break;
	}
	case ExpressionClass::BOUND_EXPRESSION:
	case ExpressionClass::COLUMN_REF:
	case ExpressionClass::LAMBDA_REF:
	case ExpressionClass::CONSTANT:
	case ExpressionClass::DEFAULT:
	case ExpressionClass::PARAMETER:
	case ExpressionClass::POSITIONAL_REFERENCE:
		// these node types have no children
		break;
	default:
		// called on non ParsedExpression type!
		throw NotImplementedException("Unimplemented expression class");
	}
}